

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void block_expr(Vm *vm)

{
  TokenType TVar1;
  CallFrame *pCVar2;
  uint64_t uVar3;
  
  primary(vm);
  if ((vm->compiler).previous.type == TOKEN_CLOSE_BRACE) {
    return;
  }
  open_scope(vm);
  while ((TVar1 = (vm->compiler).token.type, TVar1 != TOKEN_CLOSE_BRACE && (TVar1 != TOKEN_EOF))) {
    stmt(vm);
  }
  pCVar2 = (vm->frames).frame_pointers[vm->frame_count - 1];
  uVar3 = (pCVar2->code_buffer).count;
  if ((pCVar2->code_buffer).code[uVar3 - 1] == '\x1b') {
    (pCVar2->code_buffer).count = uVar3 - 1;
  }
  close_scope(vm);
  advance(vm);
  return;
}

Assistant:

static void block_expr(Vm *vm) {
    primary(vm);

    if (vm->compiler.previous.type == TOKEN_CLOSE_BRACE) {
        return;
    }

    open_scope(vm);
    while (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
        stmt(vm);
    }

    // block expression needs a return value
    if (last_instruction(vm) == OP_POP) {
        remove_arg(vm);
    }

    close_scope(vm);
    advance(vm);
}